

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmtobj.cpp
# Opt level: O1

void __thiscall
CVmObjTads::reload_from_image(CVmObjTads *this,vm_obj_id_t self,char *ptr,size_t siz)

{
  ushort uVar1;
  vm_tadsobj_hdr *hdr;
  vm_tadsobj_hdr *pvVar2;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t siz_00;
  
  hdr = (vm_tadsobj_hdr *)(this->super_CVmObject).ext_;
  uVar1 = *(ushort *)ptr;
  hdr->prop_entry_free = 0;
  memset(hdr->hash_arr,0,(ulong)hdr->hash_siz << 3);
  siz_00 = extraout_RDX;
  if (hdr->sc_cnt < uVar1) {
    pvVar2 = vm_tadsobj_hdr::expand_to(this,hdr,(ulong)uVar1,(ulong)hdr->prop_entry_cnt);
    (this->super_CVmObject).ext_ = (char *)pvVar2;
    siz_00 = extraout_RDX_00;
  }
  load_image_props_and_scs(this,ptr,siz_00);
  *(byte *)&hdr->intern_obj_flags = (byte)hdr->intern_obj_flags & 0xfd;
  CVmObjTable::request_post_load_init(&G_obj_table_X,self);
  return;
}

Assistant:

void CVmObjTads::reload_from_image(VMG_ vm_obj_id_t self,
                                   const char *ptr, size_t siz)
{
    /* get my header */
    vm_tadsobj_hdr *hdr = get_hdr();

    /* get the number of superclasses */
    ushort sc_cnt = osrp2(ptr);

    /* 
     *   Clear the property table.  We don't have to worry about the new
     *   property table being larger than the existing property table,
     *   because we can't have shrunk since we were originally loaded.  So,
     *   all we need to do is mark all property entries as free and clear
     *   out the hash table.  
     */
    hdr->prop_entry_free = 0;
    memset(hdr->hash_arr, 0, hdr->hash_siz * sizeof(hdr->hash_arr[0]));

    /* if we need space for more superclasses, reallocate the header */
    if (sc_cnt > hdr->sc_cnt)
    {
        /* allocate the new header */
        ext_ = (char *)vm_tadsobj_hdr::expand_to(
            vmg_ this, hdr, sc_cnt, hdr->prop_entry_cnt);
    }

    /* reload the image properties and superclasses */
    load_image_props_and_scs(vmg_ ptr, siz);

    /* we're now unmodified from the image file state */
    hdr->intern_obj_flags &= ~VMTO_OBJ_MOD;

    /* request post-load initialization, to set up the superclass list */
    G_obj_table->request_post_load_init(self);
}